

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall L13_1::Player::Player(Player *this,string *name,bool is_playing)

{
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->_is_playing = is_playing;
  return;
}

Assistant:

Player::Player(const string &name, bool is_playing) {
        _name = name;
        _is_playing = is_playing;
    }